

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

int isBinary(char p)

{
  uint uVar1;
  undefined3 in_register_00000039;
  
  uVar1 = CONCAT31(in_register_00000039,p) - 0x2a;
  if (((0x16 < uVar1) || ((0x5c002fU >> (uVar1 & 0x1f) & 1) == 0)) &&
     (CONCAT31(in_register_00000039,p) != 0x7e)) {
    return 0;
  }
  return 1;
}

Assistant:

int isBinary(char p)
{
    switch (p) {
    case '+':
    case '*':
    case '-':
    case '/':
    case '<':
    case '=':
    case '>':
    case '@':
    case '~':
    case ',':
        return 1;
    }
    return 0;
}